

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O0

void * Pm_QueuePeek(PmQueue *q)

{
  undefined4 uVar1;
  PmError PVar2;
  PmQueueRep *queue;
  int32_t temp;
  PmError rslt;
  PmQueue *q_local;
  
  if (q == (PmQueue *)0x0) {
    q_local = (PmQueue *)0x0;
  }
  else if (*(int *)((long)q + 0x38) == 0) {
    uVar1 = *(undefined4 *)((long)q + 0x24);
    *(undefined4 *)((long)q + 0x24) = 0;
    PVar2 = Pm_Dequeue(q,*(void **)((long)q + 0x30));
    *(undefined4 *)((long)q + 0x24) = uVar1;
    if (PVar2 == pmGotData) {
      *(undefined4 *)((long)q + 0x38) = 1;
      q_local = *(PmQueue **)((long)q + 0x30);
    }
    else {
      if (PVar2 == pmBufferOverflow) {
        *(undefined4 *)((long)q + 0x24) = 1;
      }
      q_local = (PmQueue *)0x0;
    }
  }
  else {
    q_local = *(PmQueue **)((long)q + 0x30);
  }
  return q_local;
}

Assistant:

PMEXPORT void *Pm_QueuePeek(PmQueue *q)
{
    PmError rslt;
    int32_t temp;
    PmQueueRep *queue = (PmQueueRep *) q;
    /* arg checking */
    if (!queue)
        return NULL;

    if (queue->peek_flag) {
        return queue->peek;
    }
    /* this is ugly: if peek_overflow is set, then Pm_Dequeue() 
     * returns immediately with pmBufferOverflow, but here, we
     * want Pm_Dequeue() to really check for data. If data is
     * there, we can return it
     */
    temp = queue->peek_overflow;
    queue->peek_overflow = FALSE;
    rslt = Pm_Dequeue(q, queue->peek);
    queue->peek_overflow = temp;

    if (rslt == 1) {
        queue->peek_flag = TRUE;
        return queue->peek;
    } else if (rslt == pmBufferOverflow) {
        /* when overflow is indicated, the queue is empty and the 
         * first message that was dropped by Enqueue (signalling
         * pmBufferOverflow to its caller) would have been the next
         * message in the queue. Pm_QueuePeek will return NULL, but
         * remember that an overflow occurred. (see Pm_Dequeue)
         */
        queue->peek_overflow = TRUE;
    }
    return NULL;
}